

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O3

int __thiscall
dynet::FastLSTMBuilder::copy(FastLSTMBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ulong uVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  pointer pvVar3;
  pointer pvVar4;
  pointer pPVar5;
  ulong uVar6;
  ostringstream oss;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  pvVar3 = (this->params).
           super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->params).
           super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar1 = (long)pvVar4 - (long)pvVar3;
  if (uVar1 == *(long *)(dst + 0xd8) - *(long *)(dst + 0xd0)) {
    if (pvVar4 != pvVar3) {
      uVar1 = 0;
      do {
        pPVar5 = pvVar3[uVar1].
                 super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pvVar3[uVar1].super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
            _M_impl.super__Vector_impl_data._M_finish != pPVar5) {
          uVar6 = 0;
          do {
            pPVar5[uVar6].p =
                 *(ParameterStorage **)(*(long *)(*(long *)(dst + 0xd0) + uVar1 * 0x18) + uVar6 * 8)
            ;
            uVar6 = uVar6 + 1;
            pvVar3 = (this->params).
                     super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pPVar5 = pvVar3[uVar1].
                     super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl
                     .super__Vector_impl_data._M_start;
          } while (uVar6 < (ulong)((long)pvVar3[uVar1].
                                         super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5
                                  >> 3));
          pvVar4 = (this->params).
                   super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < (ulong)(((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555));
    }
    return (int)uVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "Attempt to copy FastLSTMBuilder with different number of parameters (",0x45);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastLSTMBuilder::copy(const RNNBuilder & rnn) {
  const FastLSTMBuilder & rnn_lstm = (const FastLSTMBuilder&)rnn;
  DYNET_ARG_CHECK(params.size() == rnn_lstm.params.size(),
                          "Attempt to copy FastLSTMBuilder with different number of parameters "
                          "(" << params.size() << " != " << rnn_lstm.params.size() << ")");
  for(size_t i = 0; i < params.size(); ++i)
      for(size_t j = 0; j < params[i].size(); ++j)
        params[i][j] = rnn_lstm.params[i][j];
}